

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdBool32x4OperationX86X64.cpp
# Opt level: O1

bool Js::SIMDBool32x4Operation::OpAllTrue<char>(SIMDValue *simd)

{
  undefined1 auVar1 [16];
  uint i;
  long lVar2;
  Type local_18;
  ulong uStack_10;
  
  local_18 = (simd->field_0).i64[0];
  uStack_10 = (simd->field_0).i64[1];
  lVar2 = 0;
  do {
    *(char *)((long)&local_18 + lVar2) = -(*(char *)((long)&local_18 + lVar2) != '\0');
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  auVar1._8_8_ = uStack_10;
  auVar1._0_8_ = local_18;
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)((byte)(uStack_10 >> 7) & 1) << 8 |
                  (ushort)((byte)(uStack_10 >> 0xf) & 1) << 9 |
                  (ushort)((byte)(uStack_10 >> 0x17) & 1) << 10 |
                  (ushort)((byte)(uStack_10 >> 0x1f) & 1) << 0xb |
                  (ushort)((byte)(uStack_10 >> 0x27) & 1) << 0xc |
                  (ushort)((byte)(uStack_10 >> 0x2f) & 1) << 0xd |
                  (ushort)((byte)(uStack_10 >> 0x37) & 1) << 0xe |
                 (ushort)(byte)(uStack_10 >> 0x3f) << 0xf) == 0xffff;
}

Assistant:

bool SIMDBool32x4Operation::OpAllTrue(const SIMDValue& simd)
    {
        SIMDValue canonSimd = SIMDUtils::CanonicalizeToBools<T>(simd); //copy-by-value since we need to modify the copy
        X86SIMDValue x86Simd = X86SIMDValue::ToX86SIMDValue(canonSimd);
        int mask_8 = _mm_movemask_epi8(x86Simd.m128i_value); //latency 3, throughput 1
        return mask_8 == 0xFFFF;
    }